

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5Colset * sqlite3Fts5ParseColset(Fts5Parse *pParse,Fts5Colset *pColset,Fts5Token *p)

{
  byte bVar1;
  uint uVar2;
  Fts5Config *pFVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  byte *z;
  Fts5Colset *pFVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  
  z = (byte *)sqlite3Fts5Strndup(&pParse->rc,p->p,p->n);
  if (pParse->rc == 0) {
    pFVar3 = pParse->pConfig;
    if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)z);
    }
    uVar5 = pFVar3->nCol;
    if ((long)(int)uVar5 < 1) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        pcVar4 = pFVar3->azCol[uVar8];
        if (pcVar4 != (char *)0x0) {
          lVar9 = 0;
          do {
            bVar1 = pcVar4[lVar9];
            if (bVar1 == z[lVar9]) {
              if ((ulong)bVar1 == 0) goto LAB_001e0eb7;
            }
            else if (""[bVar1] != ""[z[lVar9]]) break;
            lVar9 = lVar9 + 1;
          } while( true );
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != (long)(int)uVar5);
      uVar8 = (ulong)uVar5;
    }
LAB_001e0eb7:
    uVar10 = (uint)uVar8;
    if (uVar10 == uVar5) {
      pFVar7 = (Fts5Colset *)0x0;
      sqlite3Fts5ParseError(pParse,"no such column: %s",z);
    }
    else {
      if (pColset == (Fts5Colset *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = pColset->nCol;
      }
      iVar6 = sqlite3_initialize();
      if (iVar6 == 0) {
        pFVar7 = (Fts5Colset *)sqlite3Realloc(pColset,(long)(int)uVar5 * 4 + 8);
      }
      else {
        pFVar7 = (Fts5Colset *)0x0;
      }
      if (pFVar7 == (Fts5Colset *)0x0) {
        pParse->rc = 7;
      }
      else {
        uVar8 = 0;
        if (0 < (int)uVar5) {
          do {
            uVar2 = pFVar7->aiCol[uVar8];
            if (uVar2 == uVar10) goto LAB_001e0f5c;
            if (uVar2 != uVar10 && (int)uVar10 <= (int)uVar2) goto LAB_001e0f29;
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
          uVar8 = (ulong)uVar5;
        }
LAB_001e0f29:
        if ((int)uVar8 < (int)uVar5) {
          lVar9 = (long)(int)uVar5;
          do {
            pFVar7->aiCol[lVar9] = pFVar7->aiCol[lVar9 + -1];
            lVar9 = lVar9 + -1;
          } while ((int)uVar8 < lVar9);
        }
        pFVar7->aiCol[uVar8 & 0xffffffff] = uVar10;
        pFVar7->nCol = uVar5 + 1;
      }
    }
LAB_001e0f5c:
    sqlite3_free(z);
  }
  else {
    pFVar7 = (Fts5Colset *)0x0;
  }
  if (pFVar7 == (Fts5Colset *)0x0) {
    sqlite3_free(pColset);
  }
  return pFVar7;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColset(
  Fts5Parse *pParse,              /* Store SQLITE_NOMEM here if required */
  Fts5Colset *pColset,            /* Existing colset object */
  Fts5Token *p
){
  Fts5Colset *pRet = 0;
  int iCol;
  char *z;                        /* Dequoted copy of token p */

  z = sqlite3Fts5Strndup(&pParse->rc, p->p, p->n);
  if( pParse->rc==SQLITE_OK ){
    Fts5Config *pConfig = pParse->pConfig;
    sqlite3Fts5Dequote(z);
    for(iCol=0; iCol<pConfig->nCol; iCol++){
      if( 0==sqlite3_stricmp(pConfig->azCol[iCol], z) ) break;
    }
    if( iCol==pConfig->nCol ){
      sqlite3Fts5ParseError(pParse, "no such column: %s", z);
    }else{
      pRet = fts5ParseColset(pParse, pColset, iCol);
    }
    sqlite3_free(z);
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3_free(pColset);
  }

  return pRet;
}